

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_fold3_key.c
# Opt level: O0

int onigenc_unicode_fold3_key(OnigCodePoint *codes)

{
  uint uVar1;
  int iVar2;
  int index;
  int key;
  OnigCodePoint *codes_local;
  
  uVar1 = hash(codes);
  if (((0xd < (int)uVar1) ||
      (codes_local._4_4_ = (int)onigenc_unicode_fold3_key::wordlist[(int)uVar1],
      codes_local._4_4_ < 0)) ||
     (iVar2 = onig_codes_cmp(codes,OnigUnicodeFolds3 + codes_local._4_4_,3), iVar2 != 0)) {
    codes_local._4_4_ = -1;
  }
  return codes_local._4_4_;
}

Assistant:

int
onigenc_unicode_fold3_key(OnigCodePoint codes[])
{
  static const short int wordlist[] =
    {

      62,

      47,

      31,

      57,

      41,

      25,

      52,

      36,

      20,

      67,

      15,

      10,

      5,

      0
    };


    {
      int key = hash(codes);

      if (key <= MAX_HASH_VALUE)
        {
          int index = wordlist[key];

          if (index >= 0 && onig_codes_cmp(codes, OnigUnicodeFolds3 + index, 3) == 0)
            return index;
        }
    }
  return -1;
}